

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O3

void __thiscall MeCab::Mmap<char>::Mmap(Mmap<char> *this)

{
  this->_vptr_Mmap = (_func_int **)&PTR__Mmap_00172d58;
  this->text = (char *)0x0;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->what_);
  (this->what_).str_._M_dataplus._M_p = (pointer)&(this->what_).str_.field_2;
  (this->what_).str_._M_string_length = 0;
  (this->what_).str_.field_2._M_local_buf[0] = '\0';
  this->fd = -1;
  return;
}

Assistant:

Mmap(): text(0), fd(-1) {}